

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

IVec3 __thiscall
tcu::anon_unknown_3::convertRGB8ToNativeFormat
          (anon_unknown_3 *this,RGBA *color,RasterizationArguments *args)

{
  int *piVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int iVar2;
  IVec3 IVar3;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int channelPixelValue;
  int channelBitCount;
  int channelNdx;
  RasterizationArguments *args_local;
  RGBA *color_local;
  IVec3 *pixelNativeColor;
  
  Vector<int,_3>::Vector((Vector<int,_3> *)this);
  iVar2 = extraout_EDX;
  for (channelPixelValue = 0; channelPixelValue < 3; channelPixelValue = channelPixelValue + 1) {
    if (channelPixelValue == 0) {
      local_44 = args->redBits;
    }
    else {
      if (channelPixelValue == 1) {
        local_48 = args->greenBits;
      }
      else {
        local_48 = args->blueBits;
      }
      local_44 = local_48;
    }
    if (channelPixelValue == 0) {
      local_4c = RGBA::getRed(color);
    }
    else {
      if (channelPixelValue == 1) {
        local_50 = RGBA::getGreen(color);
      }
      else {
        local_50 = RGBA::getBlue(color);
      }
      local_4c = local_50;
    }
    if (local_44 < 9) {
      piVar1 = Vector<int,_3>::operator[]((Vector<int,_3> *)this,channelPixelValue);
      *piVar1 = local_4c >> (8U - (char)local_44 & 0x1f);
      iVar2 = extraout_EDX_00;
    }
    else if (local_44 == 8) {
      piVar1 = Vector<int,_3>::operator[]((Vector<int,_3> *)this,channelPixelValue);
      *piVar1 = local_4c;
      iVar2 = extraout_EDX_01;
    }
    else {
      piVar1 = Vector<int,_3>::operator[]((Vector<int,_3> *)this,channelPixelValue);
      *piVar1 = local_4c << ((char)local_44 - 8U & 0x1f);
      iVar2 = extraout_EDX_02;
    }
  }
  IVar3.m_data[2] = iVar2;
  IVar3.m_data._0_8_ = this;
  return (IVec3)IVar3.m_data;
}

Assistant:

tcu::IVec3 convertRGB8ToNativeFormat (const tcu::RGBA& color, const RasterizationArguments& args)
{
	tcu::IVec3 pixelNativeColor;

	for (int channelNdx = 0; channelNdx < 3; ++channelNdx)
	{
		const int channelBitCount	= (channelNdx == 0) ? (args.redBits) : (channelNdx == 1) ? (args.greenBits) : (args.blueBits);
		const int channelPixelValue	= (channelNdx == 0) ? (color.getRed()) : (channelNdx == 1) ? (color.getGreen()) : (color.getBlue());

		if (channelBitCount <= 8)
			pixelNativeColor[channelNdx] = channelPixelValue >> (8 - channelBitCount);
		else if (channelBitCount == 8)
			pixelNativeColor[channelNdx] = channelPixelValue;
		else
		{
			// just in case someone comes up with 8+ bits framebuffers pixel formats. But as
			// we can only read in rgba8, we have to guess the trailing bits. Guessing 0.
			pixelNativeColor[channelNdx] = channelPixelValue << (channelBitCount - 8);
		}
	}

	return pixelNativeColor;
}